

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ProfiledNewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  JavascriptFunction *pJVar6;
  ArrayCallSiteInfo *this;
  Var aValue;
  JavascriptArray *this_00;
  uint uVar7;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo local_28;
  CallInfo callInfo_local;
  
  local_28 = callInfo;
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x455,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a4148d;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)local_40,&local_28,(Var *)&stack0x00000018);
  bVar3 = VarIsImpl<Js::JavascriptFunction>(function);
  if ((!bVar3) ||
     (pJVar6 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function),
     (pJVar6->functionInfo).ptr != (FunctionInfo *)EntryInfo::NewInstance)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x458,
                                "(VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance)"
                                ,
                                "VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance"
                               );
    if (!bVar3) goto LAB_00a4148d;
    *puVar5 = 0;
  }
  if (((ulong)local_28 & 0xfffffe) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x459,"(callInfo.Count >= 2)","callInfo.Count >= 2");
    if (!bVar3) {
LAB_00a4148d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this = (ArrayCallSiteInfo *)Arguments::operator[]((Arguments *)local_40,0);
  uVar7 = local_28._0_4_;
  if ((uVar7 & 0xffffff) == 2) {
    aValue = Arguments::operator[]((Arguments *)local_40,1);
    bVar3 = TaggedInt::Is(aValue);
    if (bVar3) {
      uVar4 = TaggedInt::ToInt32(aValue);
      if ((int)uVar4 < 0) {
LAB_00a4148f:
        JavascriptError::ThrowRangeError
                  ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr,-0x7ff5ec5b,(PCWSTR)0x0);
      }
    }
    else {
      if ((ulong)aValue >> 0x32 == 0) {
        this_00 = JavascriptLibrary::CreateArray((((function->type).ptr)->javascriptLibrary).ptr,1);
        DirectSetItemAt<void*>(this_00,0,aValue);
        goto LAB_00a41440;
      }
      args.super_Arguments.Values = (Type)JavascriptNumber::GetValue(aValue);
      uVar4 = JavascriptConversion::ToUInt32((double)args.super_Arguments.Values);
      if (((double)args.super_Arguments.Values != (double)uVar4) ||
         (NAN((double)args.super_Arguments.Values) || NAN((double)uVar4))) goto LAB_00a4148f;
    }
    if ((this == (ArrayCallSiteInfo *)0x0) ||
       (bVar3 = ArrayCallSiteInfo::IsNativeFloatArray(this), !bVar3)) {
      this_00 = JavascriptLibrary::CreateArray
                          ((((function->type).ptr)->javascriptLibrary).ptr,uVar4);
    }
    else {
      bVar3 = ArrayCallSiteInfo::IsNativeIntArray(this);
      pJVar1 = (((function->type).ptr)->javascriptLibrary).ptr;
      if (bVar3) {
        this_00 = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar1,uVar4);
      }
      else {
        this_00 = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar1,uVar4);
      }
    }
    goto LAB_00a41440;
  }
  if (this == (ArrayCallSiteInfo *)0x0) {
LAB_00a41406:
    this_00 = JavascriptLibrary::CreateArray
                        ((((function->type).ptr)->javascriptLibrary).ptr,(uVar7 & 0xffffff) - 1);
  }
  else {
    bVar3 = ArrayCallSiteInfo::IsNativeFloatArray(this);
    if (!bVar3) {
      uVar7 = local_28._0_4_;
      goto LAB_00a41406;
    }
    bVar3 = ArrayCallSiteInfo::IsNativeIntArray(this);
    pJVar1 = (((function->type).ptr)->javascriptLibrary).ptr;
    uVar4 = (local_28._0_4_ & 0xffffff) - 1;
    if (bVar3) {
      this_00 = (JavascriptArray *)JavascriptLibrary::CreateNativeIntArray(pJVar1,uVar4);
    }
    else {
      this_00 = (JavascriptArray *)JavascriptLibrary::CreateNativeFloatArray(pJVar1,uVar4);
    }
  }
  (**(code **)((long)(((JavascriptNativeArray *)&this_00->super_ArrayObject)->super_JavascriptArray)
                     .super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b0))
            (this_00,(local_28._0_4_ & 0xffffff) - 1,0,args.super_Arguments.Info,this,0);
LAB_00a41440:
  (**(code **)((long)(((JavascriptNativeArray *)&this_00->super_ArrayObject)->super_JavascriptArray)
                     .super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject + 0x3a0))(this_00);
  return this_00;
}

Assistant:

Var JavascriptArray::ProfiledNewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrArr_ProfiledNewInstance);
        ARGUMENTS(args, callInfo);

        Assert(VarIs<JavascriptFunction>(function) &&
               VarTo<JavascriptFunction>(function)->GetFunctionInfo() == &JavascriptArray::EntryInfo::NewInstance);
        Assert(callInfo.Count >= 2);

        ArrayCallSiteInfo *arrayInfo = (ArrayCallSiteInfo*)args[0];
        JavascriptArray* pNew = nullptr;

        if (callInfo.Count == 2)
        {
            // Exactly one argument, which is the array length if it's a uint32.
            Var firstArgument = args[1];
            int elementCount;
            if (TaggedInt::Is(firstArgument))
            {
                elementCount = TaggedInt::ToInt32(firstArgument);
                if (elementCount < 0)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(elementCount);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(elementCount);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(elementCount);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(firstArgument))
            {
                // Non-tagged-int number: make sure the double value is really a uint32.
                double value = JavascriptNumber::GetValue(firstArgument);
                uint32 uvalue = JavascriptConversion::ToUInt32(value);
                if (value != uvalue)
                {
                    JavascriptError::ThrowRangeError(function->GetScriptContext(), JSERR_ArrayLengthConstructIncorrect);
                }
                if (arrayInfo && arrayInfo->IsNativeArray())
                {
                    if (arrayInfo->IsNativeIntArray())
                    {
                        pNew = function->GetLibrary()->CreateNativeIntArray(uvalue);
                    }
                    else
                    {
                        pNew = function->GetLibrary()->CreateNativeFloatArray(uvalue);
                    }
                }
                else
                {
                    pNew = function->GetLibrary()->CreateArray(uvalue);
                }
            }
            else
            {
                //
                // First element is not int/double
                // create an array of length 1.
                // Set first element as the passed Var
                //

                pNew = function->GetLibrary()->CreateArray(1);
                pNew->DirectSetItemAt<Var>(0, firstArgument);
            }
        }
        else
        {
            // Called with a list of initial element values.
            // Create an array of the appropriate length and walk the list.

            if (arrayInfo && arrayInfo->IsNativeArray())
            {
                if (arrayInfo->IsNativeIntArray())
                {
                    pNew = function->GetLibrary()->CreateNativeIntArray(callInfo.Count - 1);
                }
                else
                {
                    pNew = function->GetLibrary()->CreateNativeFloatArray(callInfo.Count - 1);
                }
            }
            else
            {
                pNew = function->GetLibrary()->CreateArray(callInfo.Count - 1);
            }
            pNew->FillFromArgs(callInfo.Count - 1, 0, args.Values, arrayInfo);
        }

#ifdef VALIDATE_ARRAY
        pNew->ValidateArray();
#endif
        return pNew;
        JIT_HELPER_END(ScrArr_ProfiledNewInstance);
    }